

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cx_string.hpp
# Opt level: O0

void __thiscall mserialize::cx_string<22UL>::cx_string(cx_string<22UL> *this,char *str)

{
  long in_RSI;
  void *in_RDI;
  size_t i;
  undefined8 local_18;
  
  memset(in_RDI,0,0x17);
  for (local_18 = 0; local_18 < 0x16; local_18 = local_18 + 1) {
    *(undefined1 *)((long)in_RDI + local_18) = *(undefined1 *)(in_RSI + local_18);
  }
  return;
}

Assistant:

explicit constexpr cx_string(const char* str)
    :_data{0}
  {
    #if defined(__GNUC__) && !defined(__clang__)
      // https://gcc.gnu.org/bugzilla/show_bug.cgi?id=96742
      #pragma GCC diagnostic push
      #pragma GCC diagnostic ignored "-Wtype-limits"
    #endif
    for (std::size_t i = 0; i < N; ++i)
    {
      _data[i] = str[i];
    }
    #if defined(__GNUC__) && !defined(__clang__)
      #pragma GCC diagnostic pop
    #endif
  }